

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# AsmJsByteCodeWriter.cpp
# Opt level: O3

uint __thiscall
Js::AsmJsByteCodeWriter::EnterLoop(AsmJsByteCodeWriter *this,ByteCodeLabel loopEntrance)

{
  int *piVar1;
  Type *pTVar2;
  uint uVar3;
  int iVar4;
  int iVar5;
  Type pLVar6;
  code *pcVar7;
  bool bVar8;
  uint32 c1;
  undefined4 *puVar9;
  List<Js::ByteCodeWriter::LoopHeaderData,_Memory::ArenaAllocator,_false,_Js::CopyRemovePolicy,_DefaultComparer>
  *this_00;
  
  c1 = FunctionBody::IncreaseCountField((this->super_ByteCodeWriter).m_functionWrite,LoopCount);
  this_00 = (this->super_ByteCodeWriter).m_loopHeaders;
  if ((this_00->
      super_ReadOnlyList<Js::ByteCodeWriter::LoopHeaderData,_Memory::ArenaAllocator,_DefaultComparer>
      ).count != c1) {
    AssertCount = AssertCount + 1;
    Throw::LogAssert();
    puVar9 = (undefined4 *)__tls_get_addr(&PTR_01548f08);
    *puVar9 = 1;
    bVar8 = Throw::ReportAssert("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Runtime/ByteCode/AsmJsByteCodeWriter.cpp"
                                ,0x27a,"((uint)m_loopHeaders->Count() == loopId)",
                                "(uint)m_loopHeaders->Count() == loopId");
    if (!bVar8) {
      pcVar7 = (code *)invalidInstructionException();
      (*pcVar7)();
    }
    *puVar9 = 0;
    this_00 = (this->super_ByteCodeWriter).m_loopHeaders;
  }
  uVar3 = (this->super_ByteCodeWriter).m_byteCodeData.currentOffset;
  iVar4 = (this->super_ByteCodeWriter).m_loopNest;
  JsUtil::
  List<Js::ByteCodeWriter::LoopHeaderData,_Memory::ArenaAllocator,_false,_Js::CopyRemovePolicy,_DefaultComparer>
  ::EnsureArray(this_00,0);
  pLVar6 = (this_00->
           super_ReadOnlyList<Js::ByteCodeWriter::LoopHeaderData,_Memory::ArenaAllocator,_DefaultComparer>
           ).buffer;
  iVar5 = (this_00->
          super_ReadOnlyList<Js::ByteCodeWriter::LoopHeaderData,_Memory::ArenaAllocator,_DefaultComparer>
          ).count;
  pLVar6[iVar5].startOffset = uVar3;
  pLVar6[iVar5].endOffset = 0;
  pLVar6[iVar5].isNested = 0 < iVar4;
  pLVar6[iVar5].hasYield = false;
  pTVar2 = &(this_00->
            super_ReadOnlyList<Js::ByteCodeWriter::LoopHeaderData,_Memory::ArenaAllocator,_DefaultComparer>
            ).count;
  *pTVar2 = *pTVar2 + 1;
  piVar1 = &(this->super_ByteCodeWriter).m_loopNest;
  *piVar1 = *piVar1 + 1;
  ByteCodeWriter::MarkLabel(&this->super_ByteCodeWriter,loopEntrance);
  ByteCodeWriter::Data::Encode
            (&(this->super_ByteCodeWriter).m_byteCodeData,Label,&this->super_ByteCodeWriter);
  AsmJsUnsigned1(this,AsmJsLoopBodyStart,c1);
  return c1;
}

Assistant:

uint AsmJsByteCodeWriter::EnterLoop(Js::ByteCodeLabel loopEntrance)
    {
        uint loopId = m_functionWrite->IncrLoopCount();
        Assert((uint)m_loopHeaders->Count() == loopId);

        m_loopHeaders->Add(LoopHeaderData(m_byteCodeData.GetCurrentOffset(), 0, m_loopNest > 0, false));
        m_loopNest++;
        Js::OpCodeAsmJs loopBodyOpcode = Js::OpCodeAsmJs::AsmJsLoopBodyStart;
        this->MarkAsmJsLabel(loopEntrance);
        this->AsmJsUnsigned1(loopBodyOpcode, loopId);

        return loopId;
    }